

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateCharacterLiteral(ExpressionEvalContext *ctx,ExprCharacterLiteral *expression)

{
  undefined1 uVar1;
  Allocator *pAVar2;
  TypeBase *pTVar3;
  int iVar4;
  undefined4 extraout_var;
  ExprBase *pEVar5;
  
  pAVar2 = ctx->ctx->allocator;
  iVar4 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
  pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar4);
  uVar1 = (expression->super_ExprBase).field_0x29;
  pEVar5->typeID = 4;
  pTVar3 = (expression->super_ExprBase).type;
  pEVar5->source = (expression->super_ExprBase).source;
  pEVar5->type = pTVar3;
  pEVar5->next = (ExprBase *)0x0;
  pEVar5->listed = false;
  pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3398;
  pEVar5->field_0x29 = uVar1;
  pEVar5 = CheckType(&expression->super_ExprBase,pEVar5);
  return pEVar5;
}

Assistant:

ExprBase* EvaluateCharacterLiteral(ExpressionEvalContext &ctx, ExprCharacterLiteral *expression)
{
	return CheckType(expression, new (ctx.ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(expression->source, expression->type, expression->value));
}